

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precomputed_scalar_reference_finite_element.h
# Opt level: O0

void __thiscall
lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
PrecomputedScalarReferenceFiniteElement
          (PrecomputedScalarReferenceFiniteElement<double> *this,
          ScalarReferenceFiniteElement<double> *fe,QuadRule *qr)

{
  ScalarReferenceFiniteElement<double> *pSVar1;
  MatrixXd *pMVar2;
  QuadRule *qr_local;
  ScalarReferenceFiniteElement<double> *fe_local;
  PrecomputedScalarReferenceFiniteElement<double> *this_local;
  
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  lf::fe::ScalarReferenceFiniteElement<double>::ScalarReferenceFiniteElement
            (&this->super_ScalarReferenceFiniteElement<double>);
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__PrecomputedScalarReferenceFiniteElement_00897d00;
  this->fe_ = fe;
  quad::QuadRule::QuadRule(&this->qr_,qr);
  pSVar1 = this->fe_;
  pMVar2 = quad::QuadRule::Points(&this->qr_);
  (*pSVar1->_vptr_ScalarReferenceFiniteElement[7])(&this->shap_fun_,pSVar1,pMVar2);
  pSVar1 = this->fe_;
  pMVar2 = quad::QuadRule::Points(&this->qr_);
  (*pSVar1->_vptr_ScalarReferenceFiniteElement[8])(&this->grad_shape_fun_,pSVar1,pMVar2);
  return;
}

Assistant:

PrecomputedScalarReferenceFiniteElement(
      lf::fe::ScalarReferenceFiniteElement<SCALAR> const* fe, quad::QuadRule qr)
      : lf::fe::ScalarReferenceFiniteElement<SCALAR>(),
        fe_(fe),
        qr_(std::move(qr)),
        shap_fun_(fe_->EvalReferenceShapeFunctions(qr_.Points())),
        grad_shape_fun_(fe_->GradientsReferenceShapeFunctions(qr_.Points())) {}